

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O3

bool re2::RE2::Arg::parse_int_radix(char *str,int n,void *dest,int radix)

{
  bool bVar1;
  long r;
  long local_10;
  
  bVar1 = parse_long_radix(str,n,&local_10,radix);
  if ((bVar1) && ((int)local_10 == local_10)) {
    bVar1 = true;
    if (dest != (void *)0x0) {
      *(int *)dest = (int)local_10;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool RE2::Arg::parse_int_radix(const char* str,
                              int n,
                              void* dest,
                              int radix) {
  long r;
  if (!parse_long_radix(str, n, &r, radix)) return false; // Could not parse
  if ((int)r != r) return false;         // Out of range
  if (dest == NULL) return true;
  *(reinterpret_cast<int*>(dest)) = r;
  return true;
}